

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters_ssse3_intr.c
# Opt level: O0

void ihevc_intra_pred_chroma_horz_ssse3
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 *puVar13;
  int in_ECX;
  int iVar14;
  undefined8 *in_RDX;
  long in_RDI;
  int in_R8D;
  __m128i temp2;
  __m128i temp1;
  WORD32 row;
  undefined8 uStack_740;
  undefined8 uStack_720;
  undefined8 uStack_700;
  undefined8 uStack_6e0;
  int local_6c0;
  __m128i temp8;
  __m128i temp7;
  __m128i temp6;
  __m128i temp5;
  __m128i temp4;
  __m128i temp3;
  
  if (in_R8D == 8) {
    for (local_6c0 = 0; local_6c0 < 8; local_6c0 = local_6c0 + 4) {
      uVar1 = *(undefined1 *)(in_RDI + (local_6c0 * -2 + 0x1e));
      uVar2 = *(undefined1 *)(in_RDI + (int)(~(local_6c0 * 2) + 0x20));
      uVar3 = *(undefined1 *)(in_RDI + (local_6c0 * -2 + 0x1c));
      uVar4 = *(undefined1 *)(in_RDI + (int)(~(local_6c0 * 2 + 2U) + 0x20));
      uVar5 = *(undefined1 *)(in_RDI + (local_6c0 * -2 + 0x1a));
      uVar6 = *(undefined1 *)(in_RDI + (int)(~(local_6c0 * 2 + 4U) + 0x20));
      uVar7 = *(undefined1 *)(in_RDI + (local_6c0 * -2 + 0x18));
      uVar8 = *(undefined1 *)(in_RDI + (int)(~(local_6c0 * 2 + 6U) + 0x20));
      uStack_6e0._0_2_ = CONCAT11(uVar2,uVar1);
      uStack_6e0._0_3_ = CONCAT12(uVar1,(undefined2)uStack_6e0);
      uStack_6e0._0_4_ = CONCAT13(uVar2,(undefined3)uStack_6e0);
      uStack_6e0._0_5_ = CONCAT14(uVar1,(undefined4)uStack_6e0);
      uStack_6e0._0_6_ = CONCAT15(uVar2,(undefined5)uStack_6e0);
      uStack_6e0._0_7_ = CONCAT16(uVar1,(undefined6)uStack_6e0);
      uStack_6e0 = CONCAT17(uVar2,(undefined7)uStack_6e0);
      uStack_700._0_2_ = CONCAT11(uVar4,uVar3);
      uStack_700._0_3_ = CONCAT12(uVar3,(undefined2)uStack_700);
      uStack_700._0_4_ = CONCAT13(uVar4,(undefined3)uStack_700);
      uStack_700._0_5_ = CONCAT14(uVar3,(undefined4)uStack_700);
      uStack_700._0_6_ = CONCAT15(uVar4,(undefined5)uStack_700);
      uStack_700._0_7_ = CONCAT16(uVar3,(undefined6)uStack_700);
      uStack_700 = CONCAT17(uVar4,(undefined7)uStack_700);
      uStack_720._0_2_ = CONCAT11(uVar6,uVar5);
      uStack_720._0_3_ = CONCAT12(uVar5,(undefined2)uStack_720);
      uStack_720._0_4_ = CONCAT13(uVar6,(undefined3)uStack_720);
      uStack_720._0_5_ = CONCAT14(uVar5,(undefined4)uStack_720);
      uStack_720._0_6_ = CONCAT15(uVar6,(undefined5)uStack_720);
      uStack_720._0_7_ = CONCAT16(uVar5,(undefined6)uStack_720);
      uStack_720 = CONCAT17(uVar6,(undefined7)uStack_720);
      uStack_740._0_2_ = CONCAT11(uVar8,uVar7);
      uStack_740._0_3_ = CONCAT12(uVar7,(undefined2)uStack_740);
      uStack_740._0_4_ = CONCAT13(uVar8,(undefined3)uStack_740);
      uStack_740._0_5_ = CONCAT14(uVar7,(undefined4)uStack_740);
      uStack_740._0_6_ = CONCAT15(uVar8,(undefined5)uStack_740);
      uStack_740._0_7_ = CONCAT16(uVar7,(undefined6)uStack_740);
      uStack_740 = CONCAT17(uVar8,(undefined7)uStack_740);
      puVar13 = (undefined8 *)((long)in_RDX + (long)(local_6c0 * in_ECX));
      *puVar13 = CONCAT17(uVar2,CONCAT16(uVar1,CONCAT15(uVar2,CONCAT14(uVar1,CONCAT13(uVar2,CONCAT12
                                                  (uVar1,CONCAT11(uVar2,uVar1)))))));
      puVar13[1] = uStack_6e0;
      puVar13 = (undefined8 *)((long)in_RDX + (long)((local_6c0 + 1) * in_ECX));
      *puVar13 = CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar3,CONCAT13(uVar4,CONCAT12
                                                  (uVar3,CONCAT11(uVar4,uVar3)))))));
      puVar13[1] = uStack_700;
      puVar13 = (undefined8 *)((long)in_RDX + (long)((local_6c0 + 2) * in_ECX));
      *puVar13 = CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar6,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12
                                                  (uVar5,CONCAT11(uVar6,uVar5)))))));
      puVar13[1] = uStack_720;
      puVar13 = (undefined8 *)((long)in_RDX + (long)((local_6c0 + 3) * in_ECX));
      *puVar13 = CONCAT17(uVar8,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar7,CONCAT13(uVar8,CONCAT12
                                                  (uVar7,CONCAT11(uVar8,uVar7)))))));
      puVar13[1] = uStack_740;
    }
  }
  else if (in_R8D == 0x10) {
    for (local_6c0 = 0; local_6c0 < 0x10; local_6c0 = local_6c0 + 4) {
      uVar1 = *(undefined1 *)(in_RDI + (local_6c0 * -2 + 0x3e));
      uVar2 = *(undefined1 *)(in_RDI + (int)(~(local_6c0 * 2) + 0x40));
      uVar3 = *(undefined1 *)(in_RDI + (local_6c0 * -2 + 0x3c));
      uVar4 = *(undefined1 *)(in_RDI + (int)(~(local_6c0 * 2 + 2U) + 0x40));
      uVar5 = *(undefined1 *)(in_RDI + (local_6c0 * -2 + 0x3a));
      uVar6 = *(undefined1 *)(in_RDI + (int)(~(local_6c0 * 2 + 4U) + 0x40));
      uVar7 = *(undefined1 *)(in_RDI + (local_6c0 * -2 + 0x38));
      uVar8 = *(undefined1 *)(in_RDI + (int)(~(local_6c0 * 2 + 6U) + 0x40));
      uVar9 = CONCAT17(uVar2,CONCAT16(uVar1,CONCAT15(uVar2,CONCAT14(uVar1,CONCAT13(uVar2,CONCAT12(
                                                  uVar1,CONCAT11(uVar2,uVar1)))))));
      uStack_6e0._0_2_ = CONCAT11(uVar2,uVar1);
      uStack_6e0._0_3_ = CONCAT12(uVar1,(undefined2)uStack_6e0);
      uStack_6e0._0_4_ = CONCAT13(uVar2,(undefined3)uStack_6e0);
      uStack_6e0._0_5_ = CONCAT14(uVar1,(undefined4)uStack_6e0);
      uStack_6e0._0_6_ = CONCAT15(uVar2,(undefined5)uStack_6e0);
      uStack_6e0._0_7_ = CONCAT16(uVar1,(undefined6)uStack_6e0);
      uStack_6e0 = CONCAT17(uVar2,(undefined7)uStack_6e0);
      uVar10 = CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar3,CONCAT13(uVar4,CONCAT12(
                                                  uVar3,CONCAT11(uVar4,uVar3)))))));
      uStack_700._0_2_ = CONCAT11(uVar4,uVar3);
      uStack_700._0_3_ = CONCAT12(uVar3,(undefined2)uStack_700);
      uStack_700._0_4_ = CONCAT13(uVar4,(undefined3)uStack_700);
      uStack_700._0_5_ = CONCAT14(uVar3,(undefined4)uStack_700);
      uStack_700._0_6_ = CONCAT15(uVar4,(undefined5)uStack_700);
      uStack_700._0_7_ = CONCAT16(uVar3,(undefined6)uStack_700);
      uStack_700 = CONCAT17(uVar4,(undefined7)uStack_700);
      uVar11 = CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar6,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar5,CONCAT11(uVar6,uVar5)))))));
      uStack_720._0_2_ = CONCAT11(uVar6,uVar5);
      uStack_720._0_3_ = CONCAT12(uVar5,(undefined2)uStack_720);
      uStack_720._0_4_ = CONCAT13(uVar6,(undefined3)uStack_720);
      uStack_720._0_5_ = CONCAT14(uVar5,(undefined4)uStack_720);
      uStack_720._0_6_ = CONCAT15(uVar6,(undefined5)uStack_720);
      uStack_720._0_7_ = CONCAT16(uVar5,(undefined6)uStack_720);
      uStack_720 = CONCAT17(uVar6,(undefined7)uStack_720);
      uVar12 = CONCAT17(uVar8,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar7,CONCAT13(uVar8,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar7)))))));
      uStack_740._0_2_ = CONCAT11(uVar8,uVar7);
      uStack_740._0_3_ = CONCAT12(uVar7,(undefined2)uStack_740);
      uStack_740._0_4_ = CONCAT13(uVar8,(undefined3)uStack_740);
      uStack_740._0_5_ = CONCAT14(uVar7,(undefined4)uStack_740);
      uStack_740._0_6_ = CONCAT15(uVar8,(undefined5)uStack_740);
      uStack_740._0_7_ = CONCAT16(uVar7,(undefined6)uStack_740);
      uStack_740 = CONCAT17(uVar8,(undefined7)uStack_740);
      puVar13 = (undefined8 *)((long)in_RDX + (long)(local_6c0 * in_ECX));
      *puVar13 = uVar9;
      puVar13[1] = uStack_6e0;
      *(undefined8 *)((long)in_RDX + (long)(local_6c0 * in_ECX) + 0x10) = uVar9;
      *(undefined8 *)((long)in_RDX + (long)(local_6c0 * in_ECX) + 0x18) = uStack_6e0;
      puVar13 = (undefined8 *)((long)in_RDX + (long)((local_6c0 + 1) * in_ECX));
      *puVar13 = uVar10;
      puVar13[1] = uStack_700;
      iVar14 = (local_6c0 + 1) * in_ECX;
      *(undefined8 *)((long)in_RDX + (long)iVar14 + 0x10) = uVar10;
      *(undefined8 *)((long)in_RDX + (long)iVar14 + 0x18) = uStack_700;
      puVar13 = (undefined8 *)((long)in_RDX + (long)((local_6c0 + 2) * in_ECX));
      *puVar13 = uVar11;
      puVar13[1] = uStack_720;
      iVar14 = (local_6c0 + 2) * in_ECX;
      *(undefined8 *)((long)in_RDX + (long)iVar14 + 0x10) = uVar11;
      *(undefined8 *)((long)in_RDX + (long)iVar14 + 0x18) = uStack_720;
      puVar13 = (undefined8 *)((long)in_RDX + (long)((local_6c0 + 3) * in_ECX));
      *puVar13 = uVar12;
      puVar13[1] = uStack_740;
      iVar14 = (local_6c0 + 3) * in_ECX;
      *(undefined8 *)((long)in_RDX + (long)iVar14 + 0x10) = uVar12;
      *(undefined8 *)((long)in_RDX + (long)iVar14 + 0x18) = uStack_740;
    }
  }
  else {
    uVar1 = *(undefined1 *)(in_RDI + (in_R8D * 4 + -2));
    uVar2 = *(undefined1 *)(in_RDI + (in_R8D * 4 + -1));
    uVar3 = *(undefined1 *)(in_RDI + (in_R8D * 4 + -4));
    uVar4 = *(undefined1 *)(in_RDI + (in_R8D * 4 + -3));
    uVar5 = *(undefined1 *)(in_RDI + (in_R8D * 4 + -6));
    uVar6 = *(undefined1 *)(in_RDI + (in_R8D * 4 + -5));
    uVar7 = *(undefined1 *)(in_RDI + (in_R8D * 4 + -8));
    uVar8 = *(undefined1 *)(in_RDI + (in_R8D * 4 + -7));
    *in_RDX = CONCAT17(uVar2,CONCAT16(uVar1,CONCAT15(uVar2,CONCAT14(uVar1,CONCAT13(uVar2,CONCAT12(
                                                  uVar1,CONCAT11(uVar2,uVar1)))))));
    *(ulong *)((long)in_RDX + (long)in_ECX) =
         CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar3,CONCAT13(uVar4,CONCAT12(uVar3,
                                                  CONCAT11(uVar4,uVar3)))))));
    *(ulong *)((long)in_RDX + (long)(in_ECX * 2)) =
         CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar6,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(uVar5,
                                                  CONCAT11(uVar6,uVar5)))))));
    *(ulong *)((long)in_RDX + (long)(in_ECX * 3)) =
         CONCAT17(uVar8,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar7,CONCAT13(uVar8,CONCAT12(uVar7,
                                                  CONCAT11(uVar8,uVar7)))))));
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_horz_ssse3(UWORD8 *pu1_ref,
                                        WORD32 src_strd,
                                        UWORD8 *pu1_dst,
                                        WORD32 dst_strd,
                                        WORD32 nt,
                                        WORD32 mode)
{

    WORD32 row;
    __m128i temp1, temp2, temp3, temp4, temp5, temp6,  temp7, temp8;
    UNUSED(src_strd);
    UNUSED(mode);

    /* Replication to next rows*/

    if(nt == 8)
    {
        for(row = 0; row < nt; row += 4)
        {
            temp1 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 0)]);
            temp2 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 0)]);
            temp3 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 1)]);
            temp4 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 1)]);
            temp5 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 2)]);
            temp6 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 2)]);
            temp7 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 3)]);
            temp8 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 3)]);

            temp2 = _mm_unpacklo_epi8(temp1, temp2);
            temp4 = _mm_unpacklo_epi8(temp3, temp4);
            temp6 = _mm_unpacklo_epi8(temp5, temp6);
            temp8 = _mm_unpacklo_epi8(temp7, temp8);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), temp4);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), temp8);

        }
    }
    else if(nt == 16)
    {
        for(row = 0; row < nt; row += 4)
        {
            temp1 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 0)]);
            temp2 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 0)]);

            temp3 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 1)]);
            temp4 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 1)]);

            temp5 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 2)]);
            temp6 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 2)]);

            temp7 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 3)]);
            temp8 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 3)]);

            temp2 = _mm_unpacklo_epi8(temp1, temp2);
            temp4 = _mm_unpacklo_epi8(temp3, temp4);
            temp6 = _mm_unpacklo_epi8(temp5, temp6);
            temp8 = _mm_unpacklo_epi8(temp7, temp8);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd) + 0), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd) + 16), temp2);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd) + 0), temp4);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd) + 16), temp4);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd) + 0), temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd) + 16), temp6);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd) + 0), temp8);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd) + 16), temp8);


        }
    }
    else
    {
        temp1 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * 0]);
        temp2 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * 0]);

        temp3 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * 1]);
        temp4 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * 1]);

        temp5 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * 2]);
        temp6 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * 2]);

        temp7 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * 3]);
        temp8 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * 3]);

        temp2 = _mm_unpacklo_epi8(temp1, temp2);
        temp4 = _mm_unpacklo_epi8(temp3, temp4);
        temp6 = _mm_unpacklo_epi8(temp5, temp6);
        temp8 = _mm_unpacklo_epi8(temp7, temp8);

        _mm_storel_epi64((__m128i *)(pu1_dst + (0 * dst_strd)), temp2);
        _mm_storel_epi64((__m128i *)(pu1_dst + (1 * dst_strd)), temp4);
        _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), temp6);
        _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), temp8);
    }
}